

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

_Bool ppk_encrypted_s(BinarySource *src,char **commentptr)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  char *ptr;
  _Bool _Var4;
  char header [40];
  
  if (commentptr != (char **)0x0) {
    *commentptr = (char *)0x0;
  }
  _Var1 = read_header(src,header);
  if ((_Var1) &&
     ((((iVar2 = bcmp(header,"PuTTY-User-Key-File-3",0x16), iVar2 == 0 ||
        (iVar2 = bcmp(header,"PuTTY-User-Key-File-2",0x16), iVar2 == 0)) ||
       (iVar2 = bcmp(header,"PuTTY-User-Key-File-1",0x16), iVar2 == 0)) &&
      (pcVar3 = read_body(src), pcVar3 != (char *)0x0)))) {
    safefree(pcVar3);
    _Var1 = read_header(src,header);
    if (((_Var1) && (iVar2 = bcmp(header,"Encryption",0xb), iVar2 == 0)) &&
       (pcVar3 = read_body(src), pcVar3 != (char *)0x0)) {
      _Var1 = read_header(src,header);
      _Var4 = true;
      if (((_Var1) && (header._0_8_ == 0x746e656d6d6f43)) &&
         (ptr = read_body(src), ptr != (char *)0x0)) {
        if (commentptr == (char **)0x0) {
          safefree(ptr);
        }
        else {
          *commentptr = ptr;
        }
        iVar2 = strcmp(pcVar3,"aes256-cbc");
        _Var4 = iVar2 == 0;
      }
      safefree(pcVar3);
      return _Var4;
    }
  }
  return false;
}

Assistant:

bool ppk_encrypted_s(BinarySource *src, char **commentptr)
{
    char header[40], *b, *comment;
    bool ret;

    if (commentptr)
        *commentptr = NULL;

    if (!read_header(src, header)
        || (0 != strcmp(header, "PuTTY-User-Key-File-3") &&
            0 != strcmp(header, "PuTTY-User-Key-File-2") &&
            0 != strcmp(header, "PuTTY-User-Key-File-1"))) {
        return false;
    }
    if ((b = read_body(src)) == NULL) {
        return false;
    }
    sfree(b);                          /* we don't care about key type here */
    /* Read the Encryption header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Encryption")) {
        return false;
    }
    if ((b = read_body(src)) == NULL) {
        return false;
    }

    /* Read the Comment header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Comment")) {
        sfree(b);
        return true;
    }
    if ((comment = read_body(src)) == NULL) {
        sfree(b);
        return true;
    }

    if (commentptr)
        *commentptr = comment;
    else
        sfree(comment);

    if (!strcmp(b, "aes256-cbc"))
        ret = true;
    else
        ret = false;
    sfree(b);
    return ret;
}